

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O1

void __thiscall cinatra::context::context(context *this,uri_t *u,http_method mthd)

{
  char *pcVar1;
  size_t sVar2;
  
  pcVar1 = (u->host)._M_str;
  sVar2 = (u->host)._M_len;
  (this->host)._M_dataplus._M_p = (pointer)&(this->host).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,pcVar1,pcVar1 + sVar2);
  uri_t::get_port_abi_cxx11_(&this->port,u);
  uri_t::get_path_abi_cxx11_(&this->path,u);
  pcVar1 = (u->query)._M_str;
  sVar2 = (u->query)._M_len;
  (this->query)._M_dataplus._M_p = (pointer)&(this->query).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->query,pcVar1,pcVar1 + sVar2);
  (this->body)._M_dataplus._M_p = (pointer)&(this->body).field_2;
  (this->body)._M_string_length = 0;
  (this->body).field_2._M_local_buf[0] = '\0';
  this->method = mthd;
  return;
}

Assistant:

context(const uri_t &u, http_method mthd)
      : host(u.get_host()),
        port(u.get_port()),
        path(u.get_path()),
        query(u.get_query()),
        method(mthd) {}